

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.h
# Opt level: O0

void __thiscall lambda::Parse_ast::Call::Call(Call *this,Parse_ast *callee,Parse_ast *argument)

{
  Parse_ast *argument_local;
  Parse_ast *callee_local;
  Call *this_local;
  
  std::make_unique<lambda::Parse_ast,lambda::Parse_ast>((Parse_ast *)this);
  std::make_unique<lambda::Parse_ast,lambda::Parse_ast>((Parse_ast *)&this->argument_);
  return;
}

Assistant:

explicit Call(Parse_ast callee, Parse_ast argument)
        : callee_(std::make_unique<Parse_ast>(std::move(callee))),
          argument_(std::make_unique<Parse_ast>(std::move(argument))) {}